

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

void __thiscall QMdiArea::removeSubWindow(QMdiArea *this,QWidget *widget)

{
  QMdiAreaPrivate *this_00;
  Data *pDVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  qsizetype qVar6;
  QWidget *pQVar7;
  int iVar8;
  __atomic_base<int> removedIndex;
  long lVar9;
  long lVar10;
  QMdiSubWindow *child_00;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_68;
  QWidget *local_48;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    removeSubWindow();
    goto LAB_0044ac15;
  }
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if ((this_00->childWindows).d.size == 0) goto LAB_0044ac15;
  local_48 = (QWidget *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
  if (local_48 != (QWidget *)0x0) {
    qVar6 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                      (&this_00->childWindows,(QMdiSubWindow **)&local_48,0);
    removedIndex._M_i = (__int_type)qVar6;
    if ((__atomic_base<int>)removedIndex._M_i == (__atomic_base<int>)0xffffffff) {
      removeSubWindow();
    }
    else {
      QMdiAreaPrivate::disconnectSubWindow(this_00,&local_48->super_QObject);
      local_40 = local_48;
      local_68.d = (Data *)&local_40;
      QtPrivate::
      sequential_erase_if<QList<QPointer<QMdiSubWindow>>,QtPrivate::sequential_erase<QList<QPointer<QMdiSubWindow>>,QMdiSubWindow*>(QList<QPointer<QMdiSubWindow>>&,QMdiSubWindow*const&)::_lambda(auto:1_const&)_1_>
                (&this_00->childWindows,(anon_class_8_1_54a39814_for__M_pred *)&local_68);
      local_40 = (QWidget *)CONCAT44(local_40._4_4_,removedIndex._M_i);
      local_68.d = (Data *)&local_40;
      QtPrivate::
      sequential_erase_if<QList<int>,QtPrivate::sequential_erase<QList<int>,int>(QList<int>&,int_const&)::_lambda(auto:1_const&)_1_>
                (&this_00->indicesToActivatedChildren,
                 (anon_class_8_1_54a39814_for__M_pred_conflict *)&local_68);
      pDVar1 = (this_00->active).wp.d;
      if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
        pQVar7 = (QWidget *)0x0;
      }
      else {
        pQVar7 = (QWidget *)(this_00->active).wp.value;
      }
      QMdiAreaPrivate::updateActiveWindow(this_00,removedIndex._M_i,pQVar7 == local_48);
      QWidget::setParent(local_48,(QWidget *)0x0);
    }
    goto LAB_0044ac15;
  }
  local_68.d = (this_00->childWindows).d.d;
  pQVar2 = (this_00->childWindows).d.ptr;
  local_68.size = (this_00->childWindows).d.size;
  if (local_68.d != (Data *)0x0) {
    LOCK();
    ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.ptr = pQVar2;
  if (local_68.size == 0) {
LAB_0044ac34:
    removeSubWindow();
  }
  else {
    lVar10 = local_68.size << 4;
    lVar9 = 0;
    bVar5 = false;
    do {
      lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar9);
      if ((lVar3 == 0) || (*(int *)(lVar3 + 4) == 0)) {
        child_00 = (QMdiSubWindow *)0x0;
      }
      else {
        child_00 = *(QMdiSubWindow **)((long)&(pQVar2->wp).value + lVar9);
      }
      bVar4 = sanityCheck(child_00,"QMdiArea::removeSubWindow");
      iVar8 = 3;
      if (bVar4) {
        pQVar7 = QMdiSubWindow::widget(child_00);
        iVar8 = 0;
        if (pQVar7 == widget) {
          QMdiSubWindow::setWidget(child_00,(QWidget *)0x0);
          iVar8 = 2;
          bVar5 = true;
        }
      }
    } while (((iVar8 == 3) || (iVar8 == 0)) && (lVar9 = lVar9 + 0x10, lVar10 != lVar9));
    if (!bVar5) goto LAB_0044ac34;
  }
  QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_68);
LAB_0044ac15:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::removeSubWindow(QWidget *widget)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QMdiArea::removeSubWindow: null pointer to widget");
        return;
    }

    Q_D(QMdiArea);
    if (d->childWindows.isEmpty())
        return;

    if (QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(widget)) {
        int index = d->childWindows.indexOf(child);
        if (Q_UNLIKELY(index == -1)) {
            qWarning("QMdiArea::removeSubWindow: window is not inside workspace");
            return;
        }
        d->disconnectSubWindow(child);
        d->childWindows.removeAll(child);
        d->indicesToActivatedChildren.removeAll(index);
        d->updateActiveWindow(index, d->active == child);
        child->setParent(nullptr);
        return;
    }

    bool found = false;
    // Take a copy because child->setWidget(nullptr) will indirectly
    // QCoreApplication::sendEvent(); the latter could call unknown code that could
    // e.g. recurse into the class modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::removeSubWindow"))
            continue;
        if (child->widget() == widget) {
            child->setWidget(nullptr);
            Q_ASSERT(!child->widget());
            found = true;
            break;
        }
    }

    if (Q_UNLIKELY(!found))
        qWarning("QMdiArea::removeSubWindow: widget is not child of any window inside QMdiArea");
}